

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalRestart(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int iVar1;
  Fts3Phrase *p;
  Fts3MultiSegReader *pFVar2;
  Fts3SegReader **ppFVar3;
  Fts3SegReader *pFVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  while ((pExpr != (Fts3Expr *)0x0 && (*pRc == 0))) {
    p = pExpr->pPhrase;
    if (p != (Fts3Phrase *)0x0) {
      if ((p->doclist).bFreeList != 0) {
        sqlite3_free((p->doclist).pList);
      }
      (p->doclist).pList = (char *)0x0;
      (p->doclist).nList = 0;
      (p->doclist).bFreeList = 0;
      if (p->bIncr != 0) {
        iVar5 = p->nToken;
        if (0 < (long)iVar5) {
          lVar6 = 0;
          do {
            pFVar2 = p->aToken[lVar6].pSegcsr;
            if (pFVar2 != (Fts3MultiSegReader *)0x0) {
              pFVar2->nAdvance = 0;
              pFVar2->bRestart = 1;
              iVar1 = pFVar2->nSegment;
              if (0 < (long)iVar1) {
                ppFVar3 = pFVar2->apSegment;
                lVar7 = 0;
                do {
                  ppFVar3[lVar7]->pOffsetList = (char *)0x0;
                  pFVar4 = ppFVar3[lVar7];
                  pFVar4->nOffsetList = 0;
                  pFVar4->iDocid = 0;
                  lVar7 = lVar7 + 1;
                } while (iVar1 != lVar7);
              }
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != iVar5);
        }
        iVar5 = fts3EvalPhraseStart(pCsr,0,p);
        *pRc = iVar5;
      }
      p->pOrPoslist = (char *)0x0;
      (p->doclist).pNextDocid = (char *)0x0;
      (p->doclist).iDocid = 0;
    }
    pExpr->iDocid = 0;
    pExpr->bEof = '\0';
    pExpr->bStart = '\0';
    fts3EvalRestart(pCsr,pExpr->pLeft,pRc);
    pExpr = pExpr->pRight;
  }
  return;
}

Assistant:

static void fts3EvalRestart(
  Fts3Cursor *pCsr,
  Fts3Expr *pExpr,
  int *pRc
){
  if( pExpr && *pRc==SQLITE_OK ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;

    if( pPhrase ){
      fts3EvalInvalidatePoslist(pPhrase);
      if( pPhrase->bIncr ){
        int i;
        for(i=0; i<pPhrase->nToken; i++){
          Fts3PhraseToken *pToken = &pPhrase->aToken[i];
          assert( pToken->pDeferred==0 );
          if( pToken->pSegcsr ){
            sqlite3Fts3MsrIncrRestart(pToken->pSegcsr);
          }
        }
        *pRc = fts3EvalPhraseStart(pCsr, 0, pPhrase);
      }
      pPhrase->doclist.pNextDocid = 0;
      pPhrase->doclist.iDocid = 0;
      pPhrase->pOrPoslist = 0;
    }

    pExpr->iDocid = 0;
    pExpr->bEof = 0;
    pExpr->bStart = 0;

    fts3EvalRestart(pCsr, pExpr->pLeft, pRc);
    fts3EvalRestart(pCsr, pExpr->pRight, pRc);
  }
}